

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O0

void Rnm_ManCollect(Rnm_Man_t *p)

{
  uint uVar1;
  Gia_Man_t *pGVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Rnm_Man_t *p_local;
  
  pGStack_18 = (Gia_Obj_t *)0x0;
  Gia_ManIncrementTravId(p->pGia);
  pGVar2 = p->pGia;
  pGVar6 = Gia_ManConst0(p->pGia);
  Gia_ObjSetTravIdCurrent(pGVar2,pGVar6);
  pGVar6 = Gia_ManConst0(p->pGia);
  pGVar6->Value = 0;
  local_1c = 0;
  while( true ) {
    iVar4 = Vec_IntSize(p->vMap);
    bVar7 = false;
    if (local_1c < iVar4) {
      pGVar2 = p->pGia;
      iVar4 = Vec_IntEntry(p->vMap,local_1c);
      pGStack_18 = Gia_ManObj(pGVar2,iVar4);
      bVar7 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar4 = Gia_ObjIsCi(pGStack_18);
    if (iVar4 == 0) {
      iVar4 = Gia_ObjIsAnd(pGStack_18);
      if (iVar4 == 0) {
        __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRef.c"
                      ,0x169,"void Rnm_ManCollect(Rnm_Man_t *)");
      }
    }
    Gia_ObjSetTravIdCurrent(p->pGia,pGStack_18);
    pGStack_18->Value = local_1c + 1;
    local_1c = local_1c + 1;
  }
  Vec_IntClear(p->vObjs);
  pGVar2 = p->pGia;
  pGVar6 = Gia_ManPo(p->pGia,0);
  pVVar3 = p->vObjs;
  iVar4 = Vec_IntSize(p->vMap);
  Rnm_ManCollect_rec(pGVar2,pGVar6,pVVar3,iVar4 + 1);
  local_1c = 0;
  while( true ) {
    iVar4 = Vec_IntSize(p->vObjs);
    bVar7 = false;
    if (local_1c < iVar4) {
      pGVar2 = p->pGia;
      iVar4 = Vec_IntEntry(p->vObjs,local_1c);
      pGStack_18 = Gia_ManObj(pGVar2,iVar4);
      bVar7 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar4 = Gia_ObjIsRo(p->pGia,pGStack_18);
    if (iVar4 != 0) {
      pGVar2 = p->pGia;
      pGVar6 = Gia_ObjRoToRi(p->pGia,pGStack_18);
      pVVar3 = p->vObjs;
      iVar4 = Vec_IntSize(p->vMap);
      Rnm_ManCollect_rec(pGVar2,pGVar6,pVVar3,iVar4 + 1);
    }
    local_1c = local_1c + 1;
  }
  iVar4 = Gia_ObjIsCo(pGStack_18);
  if (iVar4 != 0) {
    uVar1 = pGStack_18->Value;
    iVar4 = Vec_IntSize(p->vMap);
    iVar5 = Vec_IntSize(p->vObjs);
    if (uVar1 == iVar4 + iVar5) {
      return;
    }
    __assert_fail("(int)pObj->Value == Vec_IntSize(p->vMap) + Vec_IntSize(p->vObjs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRef.c"
                  ,0x175,"void Rnm_ManCollect(Rnm_Man_t *)");
  }
  __assert_fail("Gia_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRef.c"
                ,0x174,"void Rnm_ManCollect(Rnm_Man_t *)");
}

Assistant:

void Rnm_ManCollect( Rnm_Man_t * p )
{
    Gia_Obj_t * pObj = NULL;
    int i;
    // mark const/PIs/PPIs
    Gia_ManIncrementTravId( p->pGia );
    Gia_ObjSetTravIdCurrent( p->pGia, Gia_ManConst0(p->pGia) );
    Gia_ManConst0(p->pGia)->Value = 0;
    Gia_ManForEachObjVec( p->vMap, p->pGia, pObj, i )
    {
        assert( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) );
        Gia_ObjSetTravIdCurrent( p->pGia, pObj );
        pObj->Value = 1 + i;
    }
    // collect objects
    Vec_IntClear( p->vObjs );
    Rnm_ManCollect_rec( p->pGia, Gia_ManPo(p->pGia, 0), p->vObjs, 1 + Vec_IntSize(p->vMap) );
    Gia_ManForEachObjVec( p->vObjs, p->pGia, pObj, i )
        if ( Gia_ObjIsRo(p->pGia, pObj) )
            Rnm_ManCollect_rec( p->pGia, Gia_ObjRoToRi(p->pGia, pObj), p->vObjs, 1 + Vec_IntSize(p->vMap) );
    // the last object should be a CO
    assert( Gia_ObjIsCo(pObj) );
    assert( (int)pObj->Value == Vec_IntSize(p->vMap) + Vec_IntSize(p->vObjs) );
}